

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

void __thiscall
neueda::cdr::findInChildren
          (cdr *this,orderedItemMap *items,cdrKey_t *key,
          vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *found)

{
  bool bVar1;
  const_iterator found_00;
  pointer ppVar2;
  cdrKey_t *in_RCX;
  orderedItemMap *in_RDX;
  cdr *in_RSI;
  __normal_iterator<const_neueda::cdr_*,_std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>_>
  *in_RDI;
  const_iterator it;
  cdrItem *item;
  const_iterator it0;
  map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
  *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  _Self local_30;
  
  found_00 = std::
             map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
             ::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,&local_30);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>
                         *)in_RDI);
    if (ppVar2->second->mKey == *(int *)&(in_RDX->_M_t)._M_impl) {
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_> *)
                 in_RDI);
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>
                           *)in_RDI);
      if (ppVar2->second->mType == CDR_ARRAY) {
        in_stack_ffffffffffffffc0 =
             std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>::begin
                       ((vector<neueda::cdr,_std::allocator<neueda::cdr>_> *)
                        in_stack_ffffffffffffffa8);
        while( true ) {
          std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>::
          operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_> *)
                     in_RDI);
          in_stack_ffffffffffffffb8 =
               std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>::end
                         ((vector<neueda::cdr,_std::allocator<neueda::cdr>_> *)
                          in_stack_ffffffffffffffa8);
          bVar1 = __gnu_cxx::operator!=
                            (in_RDI,(__normal_iterator<neueda::cdr_*,_std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>_>
                                     *)in_stack_ffffffffffffffa8);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<const_neueda::cdr_*,_std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>_>
          ::operator->((__normal_iterator<const_neueda::cdr_*,_std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>_>
                        *)&stack0xffffffffffffffc0);
          findInChildren(in_RSI,in_RDX,in_RCX,
                         (vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>
                          *)found_00._M_node);
          __gnu_cxx::
          __normal_iterator<const_neueda::cdr_*,_std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>_>
          ::operator++((__normal_iterator<const_neueda::cdr_*,_std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>_>
                        *)&stack0xffffffffffffffc0);
        }
      }
      else {
        std::vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>::push_back
                  ((vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *)
                   in_stack_ffffffffffffffc0._M_current,
                   (value_type *)in_stack_ffffffffffffffb8._M_current);
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_> *)in_RDI)
    ;
  }
  return;
}

Assistant:

void
cdr::findInChildren (const orderedItemMap* items,
                     const cdrKey_t& key,
                     vector<const cdrItem*>& found) const
{
    orderedItemMap::const_iterator it0 = items->begin ();
    for (; it0 != items->end (); ++it0)
    {
        if (it0->second->mKey != key)
            continue;
        const cdrItem* item = it0->second;
        if (it0->second->mType == CDR_ARRAY)
        {
            vector<cdr>::const_iterator it = item->mArray.begin ();
            for (; it != it0->second->mArray.end (); ++it)
                findInChildren (&it->mOrdered, key, found);
        }
        else
            found.push_back (item);
    }
}